

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer *
Serialize<FDynamicColormap>(FSerializer *arc,char *key,FDynamicColormap **cm,FDynamicColormap **def)

{
  FWriter *pFVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint uVar5;
  FDynamicColormap *pFVar6;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_58;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_54;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_50;
  Value *desatval;
  Value *fadeval;
  Value *colorval;
  Value *val;
  FDynamicColormap **def_local;
  FDynamicColormap **cm_local;
  char *key_local;
  FSerializer *arc_local;
  
  val = (Value *)def;
  def_local = cm;
  cm_local = (FDynamicColormap **)key;
  key_local = (char *)arc;
  bVar2 = FSerializer::isWriting(arc);
  if (bVar2) {
    bVar2 = FWriter::inObject(*(FWriter **)key_local);
    if ((bVar2) && (val != (Value *)0x0)) {
      uVar4 = PalEntry::operator_cast_to_unsigned_int(&(*def_local)->Color);
      uVar3 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((val->data_).n.i64 + 8));
      if (uVar4 == uVar3) {
        uVar4 = PalEntry::operator_cast_to_unsigned_int(&(*def_local)->Fade);
        uVar3 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((val->data_).n.i64 + 0xc));
        if ((uVar4 == uVar3) && ((*def_local)->Desaturate == *(int *)((val->data_).n.i64 + 0x10))) {
          return (FSerializer *)key_local;
        }
      }
    }
    FSerializer::WriteKey((FSerializer *)key_local,(char *)cm_local);
    FWriter::StartArray(*(FWriter **)key_local);
    pFVar1 = *(FWriter **)key_local;
    uVar4 = PalEntry::operator_cast_to_unsigned_int(&(*def_local)->Color);
    FWriter::Uint(pFVar1,uVar4);
    pFVar1 = *(FWriter **)key_local;
    uVar4 = PalEntry::operator_cast_to_unsigned_int(&(*def_local)->Fade);
    FWriter::Uint(pFVar1,uVar4);
    FWriter::Uint(*(FWriter **)key_local,(*def_local)->Desaturate);
    FWriter::EndArray(*(FWriter **)key_local);
  }
  else {
    colorval = FReader::FindKey(*(FReader **)(key_local + 8),(char *)cm_local);
    if (colorval != (Value *)0x0) {
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsArray(colorval);
      if (bVar2) {
        fadeval = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](colorval,0);
        desatval = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](colorval,1);
        local_50 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](colorval,2);
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsUint(fadeval);
        if (((bVar2) &&
            (bVar2 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::IsUint(desatval), bVar2)) &&
           (bVar2 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::IsUint(local_50), bVar2)) {
          uVar5 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetUint(fadeval);
          PalEntry::PalEntry((PalEntry *)&local_54.field_0,uVar5);
          uVar5 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetUint(desatval);
          PalEntry::PalEntry((PalEntry *)&local_58.field_0,uVar5);
          uVar5 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetUint(local_50);
          pFVar6 = GetSpecialLights((PalEntry)local_54,(PalEntry)local_58,uVar5);
          *def_local = pFVar6;
          return (FSerializer *)key_local;
        }
      }
      __assert_fail("false && \"not a colormap\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x6d3,
                    "FSerializer &Serialize(FSerializer &, const char *, FDynamicColormap *&, FDynamicColormap **)"
                   );
    }
  }
  return (FSerializer *)key_local;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FDynamicColormap *&cm, FDynamicColormap **def)
{
	if (arc.isWriting())
	{
		if (arc.w->inObject() && def != nullptr && cm->Color == (*def)->Color && cm->Fade == (*def)->Fade && cm->Desaturate == (*def)->Desaturate)
		{
			return arc;
		}

		arc.WriteKey(key);
		arc.w->StartArray();
		arc.w->Uint(cm->Color);
		arc.w->Uint(cm->Fade);
		arc.w->Uint(cm->Desaturate);
		arc.w->EndArray();
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsArray())
			{
				const rapidjson::Value &colorval = (*val)[0];
				const rapidjson::Value &fadeval = (*val)[1];
				const rapidjson::Value &desatval = (*val)[2];
				if (colorval.IsUint() && fadeval.IsUint() && desatval.IsUint())
				{
					cm = GetSpecialLights(colorval.GetUint(), fadeval.GetUint(), desatval.GetUint());
					return arc;
				}
			}
			assert(false && "not a colormap");
			Printf(TEXTCOLOR_RED "object does not represent a colormap for '%s'", key);
			cm = &NormalLight;
		}
	}
	return arc;
}